

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  string_array cmd_line;
  allocator<char> local_189;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  char **local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  ilzham local_128;
  
  local_168 = argv;
  printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n","Apr 25 2025","23:55:11");
  printf("Expecting LZHAM DLL Version 0x%04X\n",0x1011);
  local_128._vptr_ilzham = (_func_int **)&PTR__ilzham_0010ac40;
  local_128.lzham_get_version = lzham_get_version;
  local_128.lzham_set_memory_callbacks = lzham_set_memory_callbacks;
  local_128.lzham_compress_init = lzham_compress_init;
  local_128.lzham_compress_deinit = lzham_compress_deinit;
  local_128.lzham_compress = lzham_compress;
  local_128.lzham_compress2 = lzham_compress2;
  local_128.lzham_compress_reinit = lzham_compress_reinit;
  local_128.lzham_compress_memory = lzham_compress_memory;
  local_128.lzham_decompress_init = lzham_decompress_init;
  local_128.lzham_decompress_reinit = lzham_decompress_reinit;
  local_128.lzham_decompress_deinit = lzham_decompress_deinit;
  local_128.lzham_decompress = lzham_decompress;
  local_128.lzham_decompress_memory = lzham_decompress_memory;
  local_128.lzham_z_version = lzham_z_version;
  local_128.lzham_z_deflateInit = lzham_z_deflateInit;
  local_128.lzham_z_deflateInit2 = lzham_z_deflateInit2;
  local_128.lzham_z_deflateReset = lzham_z_deflateReset;
  local_128.lzham_z_deflate = lzham_z_deflate;
  local_128.lzham_z_deflateEnd = lzham_z_deflateEnd;
  local_128.lzham_z_deflateBound = lzham_z_deflateBound;
  local_128.lzham_z_compress = lzham_z_compress;
  local_128.lzham_z_compress2 = lzham_z_compress2;
  local_128.lzham_z_compressBound = lzham_z_compressBound;
  local_128.lzham_z_inflateInit = lzham_z_inflateInit;
  local_128.lzham_z_inflateInit2 = lzham_z_inflateInit2;
  local_128.lzham_z_inflate = lzham_z_inflate;
  local_128.lzham_z_inflateEnd = lzham_z_inflateEnd;
  local_128.lzham_z_inflateReset = lzham_z_inflateReset;
  local_128.lzham_z_uncompress = lzham_z_uncompress;
  local_128.lzham_z_error = lzham_z_error;
  puts("Using static libraries.");
  uVar1 = lzham_get_version();
  printf("Loaded LZHAM DLL version 0x%04X\n\n",(ulong)uVar1);
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < argc) {
    uVar3 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,local_168[uVar3],&local_189);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
                 &local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,&local_188);
  iVar2 = main_internal(&local_140,-1,&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
#endif
{
   (void)g_is_debug;

#ifdef _XBOX
   int argc = 3;
   char *argv[4] = { "", "A", "E:\\samples", "" };

   DmMapDevkitDrive();
#endif

#ifdef LZHAM_64BIT
   printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#else
   printf("LZHAM Codec - x86 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#endif

   printf("Expecting LZHAM DLL Version 0x%04X\n", LZHAM_DLL_VERSION);

#if LZHAM_STATIC_LIB
   lzham_static_lib lzham_lib;
   lzham_lib.load();
   printf("Using static libraries.\n");
#else
   lzham_dll_loader lzham_lib;
   char lzham_dll_filename[MAX_PATH];
   lzham_dll_loader::create_module_path(lzham_dll_filename, MAX_PATH, g_is_debug);
   printf("Dynamically loading DLL \"%s\"\n", lzham_dll_filename);

   HRESULT hres = lzham_lib.load(lzham_dll_filename);
   if (FAILED(hres))
   {
      print_error("Failed loading LZHAM DLL (Status=0x%04X)!\n", (uint)hres);
      return EXIT_FAILURE;
   }
#endif

   // -1 = auto-detection
   int num_helper_threads = -1;

#ifdef _XBOX
   num_helper_threads = 5;
#elif defined(WIN32)
   SYSTEM_INFO g_system_info;
   GetSystemInfo(&g_system_info);
   if (g_system_info.dwNumberOfProcessors > 1)
   {
      num_helper_threads = g_system_info.dwNumberOfProcessors - 1;
   }
#endif

   printf("Loaded LZHAM DLL version 0x%04X\n\n", lzham_lib.lzham_get_version());

   string_array cmd_line;
   for (int i = 1; i < argc; i++)
   {
      cmd_line.push_back(std::string(argv[i]));
   }

   int exit_status = main_internal(cmd_line, num_helper_threads, lzham_lib);

   lzham_lib.unload();

   return exit_status;
}